

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.cc
# Opt level: O0

bool __thiscall DyndepLoader::UpdateEdge(DyndepLoader *this,Edge *edge,Dyndeps *dyndeps,string *err)

{
  BindingEnv *this_00;
  vector<Node_*,_std::allocator<Node_*>_> *pvVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  size_type sVar5;
  Edge *pEVar6;
  string *__rhs;
  reference ppNVar7;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_128;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_120;
  const_iterator i_1;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_100;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_f8;
  const_iterator local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_c8;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_c0;
  const_iterator i;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_a0;
  const_iterator local_98;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string *local_30;
  string *err_local;
  Dyndeps *dyndeps_local;
  Edge *edge_local;
  DyndepLoader *this_local;
  
  local_30 = err;
  err_local = (string *)dyndeps;
  dyndeps_local = (Dyndeps *)edge;
  edge_local = (Edge *)this;
  if ((dyndeps->restat_ & 1U) != 0) {
    this_00 = edge->env_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"restat",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"1",&local_89);
    BindingEnv::AddBinding(this_00,&local_50,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  pvVar1 = &dyndeps_local->implicit_outputs_;
  local_a0._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                          ((vector<Node_*,_std::allocator<Node_*>_> *)
                           &(dyndeps_local->implicit_outputs_).
                            super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                            super__Vector_impl_data._M_finish);
  __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
  __normal_iterator<Node**>
            ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)&local_98,
             &local_a0);
  cVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::begin
                    ((vector<Node_*,_std::allocator<Node_*>_> *)(err_local + 1));
  cVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::end
                    ((vector<Node_*,_std::allocator<Node_*>_> *)(err_local + 1));
  i._M_current = (Node **)std::vector<Node*,std::allocator<Node*>>::
                          insert<__gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>,void>
                                    ((vector<Node*,std::allocator<Node*>> *)
                                     &(pvVar1->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                                      _M_impl.super__Vector_impl_data._M_finish,local_98,
                                     cVar3._M_current,cVar4._M_current);
  sVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                    ((vector<Node_*,_std::allocator<Node_*>_> *)(err_local + 1));
  *(int *)&dyndeps_local[1].implicit_outputs_.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
           _M_impl.super__Vector_impl_data._M_finish =
       *(int *)&dyndeps_local[1].implicit_outputs_.
                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
                _M_finish + (int)sVar5;
  local_c0._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                          ((vector<Node_*,_std::allocator<Node_*>_> *)(err_local + 1));
  while( true ) {
    local_c8._M_current =
         (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                            ((vector<Node_*,_std::allocator<Node_*>_> *)(err_local + 1));
    bVar2 = __gnu_cxx::operator!=(&local_c0,&local_c8);
    if (!bVar2) {
      pvVar1 = &dyndeps_local->implicit_inputs_;
      local_100._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               &(dyndeps_local->implicit_inputs_).
                                super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                super__Vector_impl_data._M_finish);
      local_f8 = __gnu_cxx::
                 __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                 operator-(&local_100,
                           (long)*(int *)((long)&dyndeps_local[1].implicit_outputs_.
                                                 super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 4));
      __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
      __normal_iterator<Node**>
                ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)
                 &local_f0,&local_f8);
      cVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::begin
                        ((vector<Node_*,_std::allocator<Node_*>_> *)&err_local->_M_string_length);
      cVar4 = std::vector<Node_*,_std::allocator<Node_*>_>::end
                        ((vector<Node_*,_std::allocator<Node_*>_> *)&err_local->_M_string_length);
      i_1._M_current =
           (Node **)std::vector<Node*,std::allocator<Node*>>::
                    insert<__gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>,void>
                              ((vector<Node*,std::allocator<Node*>> *)
                               &(pvVar1->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                                _M_impl.super__Vector_impl_data._M_finish,local_f0,cVar3._M_current,
                               cVar4._M_current);
      sVar5 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                        ((vector<Node_*,_std::allocator<Node_*>_> *)&err_local->_M_string_length);
      *(int *)&dyndeps_local[1].implicit_outputs_.
               super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
               _M_start =
           *(int *)&dyndeps_local[1].implicit_outputs_.
                    super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start + (int)sVar5;
      local_120._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                              ((vector<Node_*,_std::allocator<Node_*>_> *)
                               &err_local->_M_string_length);
      while( true ) {
        local_128._M_current =
             (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end
                                ((vector<Node_*,_std::allocator<Node_*>_> *)
                                 &err_local->_M_string_length);
        bVar2 = __gnu_cxx::operator!=(&local_120,&local_128);
        if (!bVar2) break;
        ppNVar7 = __gnu_cxx::
                  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_120);
        Node::AddOutEdge(*ppNVar7,(Edge *)dyndeps_local);
        __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_120);
      }
      return true;
    }
    ppNVar7 = __gnu_cxx::
              __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_c0);
    pEVar6 = Node::in_edge(*ppNVar7);
    if (pEVar6 != (Edge *)0x0) break;
    ppNVar7 = __gnu_cxx::
              __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_c0);
    Node::set_in_edge(*ppNVar7,(Edge *)dyndeps_local);
    __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
    operator++(&local_c0);
  }
  ppNVar7 = __gnu_cxx::
            __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
            operator*(&local_c0);
  __rhs = Node::path_abi_cxx11_(*ppNVar7);
  std::operator+(&local_e8,"multiple rules generate ",__rhs);
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  return false;
}

Assistant:

bool DyndepLoader::UpdateEdge(Edge* edge, Dyndeps const* dyndeps,
                              std::string* err) const {
  // Add dyndep-discovered bindings to the edge.
  // We know the edge already has its own binding
  // scope because it has a "dyndep" binding.
  if (dyndeps->restat_)
    edge->env_->AddBinding("restat", "1");

  // Add the dyndep-discovered outputs to the edge.
  edge->outputs_.insert(edge->outputs_.end(),
                        dyndeps->implicit_outputs_.begin(),
                        dyndeps->implicit_outputs_.end());
  edge->implicit_outs_ += dyndeps->implicit_outputs_.size();

  // Add this edge as incoming to each new output.
  for (std::vector<Node*>::const_iterator i =
           dyndeps->implicit_outputs_.begin();
       i != dyndeps->implicit_outputs_.end(); ++i) {
    if ((*i)->in_edge() != NULL) {
      *err = "multiple rules generate " + (*i)->path();
      return false;
    }
    (*i)->set_in_edge(edge);
  }

  // Add the dyndep-discovered inputs to the edge.
  edge->inputs_.insert(edge->inputs_.end() - edge->order_only_deps_,
                       dyndeps->implicit_inputs_.begin(),
                       dyndeps->implicit_inputs_.end());
  edge->implicit_deps_ += dyndeps->implicit_inputs_.size();

  // Add this edge as outgoing from each new input.
  for (std::vector<Node*>::const_iterator i =
           dyndeps->implicit_inputs_.begin();
       i != dyndeps->implicit_inputs_.end(); ++i)
    (*i)->AddOutEdge(edge);

  return true;
}